

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  lu_byte lVar1;
  int iVar2;
  Vardesc *pVVar3;
  FuncState *pFVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Upvaldesc *pUVar8;
  BlockCnt *pBVar9;
  lu_byte *plVar10;
  long lVar11;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VVOID;
    (var->u).info = 0;
    return;
  }
  uVar5 = (uint)fs->nactvar;
  while (0 < (int)uVar5) {
    iVar2 = fs->firstlocal;
    pVVar3 = (fs->ls->dyd->actvar).arr;
    uVar6 = uVar5 - 1;
    lVar11 = (long)(int)(uVar5 + iVar2 + -1);
    uVar5 = uVar6;
    if (*(TString **)((long)pVVar3 + lVar11 * 0x18 + 0x10) == n) {
      lVar1 = (&pVVar3->vd)[lVar11].kind;
      var->t = -1;
      var->f = -1;
      if (lVar1 == '\x03') {
        var->k = VCONST;
        (var->u).info = iVar2 + uVar6;
        return;
      }
      var->k = VLOCAL;
      (var->u).var.vidx = (unsigned_short)uVar6;
      (var->u).var.ridx =
           *(lu_byte *)
            ((long)(fs->ls->dyd->actvar).arr + (long)(int)(fs->firstlocal + uVar6) * 0x18 + 10);
      if (base != 0) {
        return;
      }
      pBVar9 = (BlockCnt *)&fs->bl;
      do {
        pBVar9 = pBVar9->previous;
      } while (uVar6 < pBVar9->nactvar);
      pBVar9->upval = '\x01';
      fs->needclose = '\x01';
      return;
    }
  }
  if ((ulong)fs->nups != 0) {
    pUVar8 = fs->f->upvalues;
    uVar7 = 0;
    do {
      if (pUVar8->name == n) goto LAB_00131537;
      uVar7 = uVar7 + 1;
      pUVar8 = pUVar8 + 1;
    } while (fs->nups != uVar7);
  }
  singlevaraux(fs->prev,n,var,0);
  if (var->k - VLOCAL < 2) {
    pUVar8 = allocupvalue(fs);
    pFVar4 = fs->prev;
    if (var->k == VLOCAL) {
      pUVar8->instack = '\x01';
      pUVar8->idx = (var->u).var.ridx;
      plVar10 = &(&((pFVar4->ls->dyd->actvar).arr)->vd)
                 [(long)pFVar4->firstlocal + (ulong)(var->u).var.vidx].kind;
    }
    else {
      pUVar8->instack = '\0';
      pUVar8->idx = (var->u).var.ridx;
      plVar10 = &pFVar4->f->upvalues[(var->u).info].kind;
    }
    pUVar8->kind = *plVar10;
    pUVar8->name = n;
    if (((fs->f->marked & 0x20) != 0) && ((n->marked & 0x18) != 0)) {
      luaC_barrier_(fs->ls->L,(GCObject *)fs->f,(GCObject *)n);
    }
    uVar7 = (ulong)(fs->nups - 1);
LAB_00131537:
    var->t = -1;
    var->f = -1;
    var->k = VUPVAL;
    (var->u).info = (int)uVar7;
  }
  return;
}

Assistant:

static void singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    init_exp(var, VVOID, 0);  /* default is global */
  else {
    int v = searchvar(fs, n, var);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      if (v == VLOCAL && !base)
        markupval(fs, var->u.var.vidx);  /* local will be used as an upval */
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
        if (var->k == VLOCAL || var->k == VUPVAL)  /* local or upvalue? */
          idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
        else  /* it is a global or a constant */
          return;  /* don't need to do anything at this level */
      }
      init_exp(var, VUPVAL, idx);  /* new or old upvalue */
    }
  }
}